

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::rot(Forth *this)

{
  uint Value;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,3,"ROT");
  this_00 = &this->dStack;
  Value = ForthStack<unsigned_int>::getTop(this_00,2);
  ForthStack<unsigned_int>::moveStack(this_00,2,1,2);
  ForthStack<unsigned_int>::setTop(this_00,Value);
  return;
}

Assistant:

void rot() {
			REQUIRE_DSTACK_DEPTH(3, "ROT");
			auto n = 2;
			if (n > 0) {
				auto x = dStack.getTop(n);
				dStack.moveStack(n, n - 1, n);
				dStack.setTop(x);
			}
		}